

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O0

ZoneState * QLocalTime::utcToLocal(qint64 utcMillis)

{
  bool bVar1;
  longlong in_RSI;
  tm *in_RDI;
  long in_FS_OFFSET;
  R_conflict3 RVar2;
  optional<long_long> oVar3;
  DaylightStatus dst;
  qint64 daySeconds;
  int msec;
  time_t epochSeconds;
  qint64 localMillis;
  qint64 localSeconds;
  tm local;
  R_conflict3 epoch;
  optional<long_long> jd;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  bool bVar4;
  tm *julianDay;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  tm local_60;
  R_conflict3 local_28;
  _Storage<long_long,_true> local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.remainder = 0xaaaaaaaaaaaaaaaa;
  local_28.quotient = 0xaaaaaaaaaaaaaaaa;
  julianDay = in_RDI;
  RVar2 = QRoundingDown::qDivMod<1000U,_long_long,_true>(in_RSI);
  local_28.quotient = RVar2.quotient;
  local_28 = RVar2;
  if (local_28.quotient * 1000 + (long)(int)RVar2.remainder == in_RSI) {
    memset(&local_60,0xaa,0x38);
    bVar1 = qLocalTime(CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                       (tm *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    if (bVar1) {
      local_18 = (_Storage<long_long,_true>)0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      oVar3 = anon_unknown.dwarf_31369b::tmToJd(in_RDI);
      local_18._M_value =
           oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
           super__Optional_payload_base<long_long>._M_payload;
      local_10 = CONCAT71(local_10._1_7_,
                          oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
                          super__Optional_payload_base<long_long>._M_engaged);
      bVar1 = std::optional::operator_cast_to_bool((optional<long_long> *)0x171cf7);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        anon_unknown.dwarf_31369b::tmSecsWithinDay(&local_60);
        std::optional<long_long>::operator*((optional<long_long> *)0x171d51);
        bVar1 = anon_unknown.dwarf_31369b::daysAndSecondsOverflow
                          ((qint64)julianDay,(qint64)in_RDI,
                           (qint64 *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
        bVar4 = true;
        if (!bVar1) {
          bVar4 = anon_unknown.dwarf_31369b::secondsAndMillisOverflow
                            ((qint64)julianDay,(qint64)in_RDI,
                             (qint64 *)CONCAT17(1,in_stack_ffffffffffffff50));
        }
        if (bVar4 == false) {
          QDateTimePrivate::ZoneState::ZoneState
                    ((ZoneState *)in_RDI,-0x5555555555555556,-0x55555556 - (int)RVar2.quotient,
                     (uint)(local_60.tm_isdst != 0),true);
        }
        else {
          QDateTimePrivate::ZoneState::ZoneState((ZoneState *)in_RDI,in_RSI);
        }
      }
      else {
        QDateTimePrivate::ZoneState::ZoneState((ZoneState *)in_RDI,in_RSI);
      }
    }
    else {
      QDateTimePrivate::ZoneState::ZoneState((ZoneState *)in_RDI,in_RSI);
    }
  }
  else {
    QDateTimePrivate::ZoneState::ZoneState((ZoneState *)in_RDI,in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (ZoneState *)julianDay;
  }
  __stack_chk_fail();
}

Assistant:

QDateTimePrivate::ZoneState utcToLocal(qint64 utcMillis)
{
    const auto epoch = QRoundingDown::qDivMod<MSECS_PER_SEC>(utcMillis);
    const time_t epochSeconds = epoch.quotient;
    const int msec = epoch.remainder;
    Q_ASSERT(msec >= 0 && msec < MSECS_PER_SEC);
    if (qint64(epochSeconds) * MSECS_PER_SEC + msec != utcMillis) // time_t range too narrow
        return {utcMillis};

    tm local;
    if (!qLocalTime(epochSeconds, &local))
        return {utcMillis};

    auto jd = tmToJd(local);
    if (Q_UNLIKELY(!jd))
        return {utcMillis};

    const qint64 daySeconds = tmSecsWithinDay(local);
    Q_ASSERT(0 <= daySeconds && daySeconds < SECS_PER_DAY);
    qint64 localSeconds, localMillis;
    if (Q_UNLIKELY(daysAndSecondsOverflow(*jd, daySeconds, &localSeconds)
                   || secondsAndMillisOverflow(localSeconds, qint64(msec), &localMillis))) {
        return {utcMillis};
    }
    const auto dst
        = local.tm_isdst ? QDateTimePrivate::DaylightTime : QDateTimePrivate::StandardTime;
    return { localMillis, int(localSeconds - epochSeconds), dst };
}